

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O0

Abc_Obj_t * Abc_AigMux(Abc_Aig_t *pMan,Abc_Obj_t *pC,Abc_Obj_t *p1,Abc_Obj_t *p0)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *p0_local;
  Abc_Obj_t *p1_local;
  Abc_Obj_t *pC_local;
  Abc_Aig_t *pMan_local;
  
  pAVar1 = Abc_AigAnd(pMan,pC,p1);
  pAVar2 = Abc_ObjNot(pC);
  pAVar2 = Abc_AigAnd(pMan,pAVar2,p0);
  pAVar1 = Abc_AigOr(pMan,pAVar1,pAVar2);
  return pAVar1;
}

Assistant:

Abc_Obj_t * Abc_AigMux( Abc_Aig_t * pMan, Abc_Obj_t * pC, Abc_Obj_t * p1, Abc_Obj_t * p0 )
{
    return Abc_AigOr( pMan, Abc_AigAnd(pMan, pC, p1), Abc_AigAnd(pMan, Abc_ObjNot(pC), p0) );
}